

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

root_type *
ising::free_energy::
specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
          (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
           *f,fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *beta)

{
  root_type *in_RDI;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> b0;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f2;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f1;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f0;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffd58;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  int in_stack_fffffffffffffdf4;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_fffffffffffffdf8;
  
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
  ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
              in_stack_fffffffffffffd60);
  ::operator*(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
  ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
              in_stack_fffffffffffffd60);
  ::operator+((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
              in_stack_fffffffffffffd60);
  ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
              in_stack_fffffffffffffd60);
  ::operator-(in_stack_fffffffffffffd58);
  return in_RDI;
}

Assistant:

inline typename U::root_type specific_heat(U f, U beta) {
  auto f0 = f.derivative(0);
  auto f1 = f.derivative(1);
  auto f2 = f.derivative(2);
  auto b0 = beta.derivative(0);
  return -(b0 * b0 * (2 * f1 + b0 * f2));
}